

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_input_is_mouse_click_in_rect(nk_input *i,nk_buttons id,nk_rect b)

{
  nk_bool nVar1;
  uint uVar2;
  
  if (i == (nk_input *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    nVar1 = nk_input_has_mouse_click_down_in_rect(i,id,b,0);
    if (nVar1 != 0) {
      uVar2 = (uint)((i->mouse).buttons[id].clicked != 0);
    }
  }
  return uVar2;
}

Assistant:

NK_API nk_bool
nk_input_is_mouse_click_in_rect(const struct nk_input *i, enum nk_buttons id,
struct nk_rect b)
{
const struct nk_mouse_button *btn;
if (!i) return nk_false;
btn = &i->mouse.buttons[id];
return (nk_input_has_mouse_click_down_in_rect(i, id, b, nk_false) &&
btn->clicked) ? nk_true : nk_false;
}